

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

int __thiscall icu_63::UnicodeSet::remove(UnicodeSet *this,char *__filename)

{
  uint uVar1;
  uint uVar2;
  uint in_EDX;
  uint uVar3;
  uint uVar4;
  UChar32 range [3];
  
  uVar3 = (uint)__filename;
  uVar2 = 0x10ffff;
  if (uVar3 < 0x10ffff) {
    uVar2 = uVar3;
  }
  uVar1 = 0x10ffff;
  if (in_EDX < 0x10ffff) {
    uVar1 = in_EDX;
  }
  uVar4 = uVar1;
  if ((int)in_EDX < 0) {
    uVar4 = 0;
  }
  if (((int)uVar3 < 0) || (uVar2 <= uVar4)) {
    range[0] = 0;
    if (-1 < (int)uVar3) {
      range[0] = uVar2;
    }
    range[1] = 1;
    if (-1 < (int)in_EDX) {
      range[1] = uVar1 + 1;
    }
    range[2] = 0x110000;
    retain(this,range,2,'\x02');
  }
  return (int)this;
}

Assistant:

UnicodeSet& UnicodeSet::remove(UChar32 start, UChar32 end) {
    if (pinCodePoint(start) <= pinCodePoint(end)) {
        UChar32 range[3] = { start, end+1, UNICODESET_HIGH };
        retain(range, 2, 2);
    }
    return *this;
}